

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_tga(char *filename,int x,int y,int comp,void *data)

{
  int iVar1;
  stbi__write_context s;
  stbi__write_context sStack_38;
  
  iVar1 = stbi__start_write_file(&sStack_38,filename);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = stbi_write_tga_core(&sStack_38,x,y,comp,data);
    fclose((FILE *)sStack_38.context);
  }
  return iVar1;
}

Assistant:

STBIWDEF int stbi_write_tga(char const *filename, int x, int y, int comp, const void *data)
{
   stbi__write_context s;
   if (stbi__start_write_file(&s,filename)) {
      int r = stbi_write_tga_core(&s, x, y, comp, (void *) data);
      stbi__end_write_file(&s);
      return r;
   } else
      return 0;
}